

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O3

void spdlog::set_error_handler(_func_void_string_ptr *handler)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  details::registry::instance();
  local_28._M_unused._M_object = (_func_void_string_ptr *)0x0;
  local_28._8_8_ = 0;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  if (handler != (_func_void_string_ptr *)0x0) {
    pcStack_10 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)handler;
  }
  details::registry::set_error_handler
            (&details::registry::instance::s_instance,(err_handler *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

SPDLOG_INLINE void set_error_handler(void (*handler)(const std::string &msg)) {
    details::registry::instance().set_error_handler(handler);
}